

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

bool __thiscall
duckdb::RowGroupCollection::Append
          (RowGroupCollection *this,DataChunk *chunk,TableAppendState *state)

{
  idx_t iVar1;
  idx_t iVar2;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_00;
  bool bVar3;
  RowGroupSegmentTree *pRVar4;
  RowGroup *pRVar5;
  reference this_01;
  type this_02;
  reference v;
  pointer append_count;
  pointer slice_count;
  size_type __n;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  local_stats_lock;
  undefined1 local_68 [16];
  pointer local_58;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_50;
  TableStatistics *local_48;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_40;
  idx_t local_38;
  
  local_38 = this->row_group_size;
  DataChunk::Verify(chunk);
  slice_count = (pointer)chunk->count;
  state->total_append_count =
       (long)&(slice_count->internal).
              super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
       state->total_append_count;
  local_48 = &this->stats;
  local_50 = &this->row_groups;
  bVar3 = false;
  local_58 = slice_count;
  local_40._M_head_impl = (BlockingSample *)this;
  do {
    pRVar5 = (state->row_group_append_state).row_group;
    append_count = (pointer)(local_38 - (state->row_group_append_state).offset_in_row_group);
    if (slice_count < append_count) {
      append_count = slice_count;
    }
    if (append_count != (pointer)0x0) {
      iVar1 = pRVar5->allocation_size;
      RowGroup::Append(pRVar5,&state->row_group_append_state,chunk,(idx_t)append_count);
      this = (RowGroupCollection *)local_40._M_head_impl;
      *(idx_t *)&local_40._M_head_impl[5].type =
           *(long *)&local_40._M_head_impl[5].type + (pRVar5->allocation_size - iVar1);
      RowGroup::MergeIntoStatistics(pRVar5,local_48);
    }
    slice_count = (pointer)((long)slice_count - (long)append_count);
    if (slice_count != (pointer)0x0) {
      if (slice_count < (pointer)chunk->count) {
        DataChunk::Slice(chunk,(idx_t)append_count,(idx_t)slice_count);
      }
      this_00 = local_50;
      iVar1 = (state->row_group_append_state).offset_in_row_group;
      iVar2 = (pRVar5->super_SegmentBase<duckdb::RowGroup>).start;
      pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_50);
      local_68._0_8_ = &(pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
      local_68[8] = false;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
      local_68[8] = true;
      AppendRowGroup(this,(SegmentLock *)local_68,iVar1 + iVar2);
      pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
      pRVar5 = SegmentTree<duckdb::RowGroup,_true>::GetLastSegment
                         (&pRVar4->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)local_68
                         );
      RowGroup::InitializeAppend(pRVar5,&state->row_group_append_state);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
      bVar3 = true;
    }
  } while (slice_count != (pointer)0x0);
  state->current_row =
       (long)&(local_58->internal).
              super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
       state->current_row;
  TableStatistics::GetLock((TableStatistics *)local_68);
  if ((this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
      ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                   *)local_68);
      this_01 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                          (&(state->stats).column_stats,__n);
      this_02 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(this_01);
      v = vector<duckdb::Vector,_true>::operator[](&chunk->data,__n);
      ColumnStatistics::UpdateDistinctStatistics(this_02,v,chunk->count,&state->hashes);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)local_68);
  return bVar3;
}

Assistant:

bool RowGroupCollection::Append(DataChunk &chunk, TableAppendState &state) {
	const idx_t row_group_size = GetRowGroupSize();
	D_ASSERT(chunk.ColumnCount() == types.size());
	chunk.Verify();

	bool new_row_group = false;
	idx_t total_append_count = chunk.size();
	idx_t remaining = chunk.size();
	state.total_append_count += total_append_count;
	while (true) {
		auto current_row_group = state.row_group_append_state.row_group;
		// check how much we can fit into the current row_group
		idx_t append_count =
		    MinValue<idx_t>(remaining, row_group_size - state.row_group_append_state.offset_in_row_group);
		if (append_count > 0) {
			auto previous_allocation_size = current_row_group->GetAllocationSize();
			current_row_group->Append(state.row_group_append_state, chunk, append_count);
			allocation_size += current_row_group->GetAllocationSize() - previous_allocation_size;
			// merge the stats
			current_row_group->MergeIntoStatistics(stats);
		}
		remaining -= append_count;
		if (remaining > 0) {
			// we expect max 1 iteration of this loop (i.e. a single chunk should never overflow more than one
			// row_group)
			D_ASSERT(chunk.size() == remaining + append_count);
			// slice the input chunk
			if (remaining < chunk.size()) {
				chunk.Slice(append_count, remaining);
			}
			// append a new row_group
			new_row_group = true;
			auto next_start = current_row_group->start + state.row_group_append_state.offset_in_row_group;

			auto l = row_groups->Lock();
			AppendRowGroup(l, next_start);
			// set up the append state for this row_group
			auto last_row_group = row_groups->GetLastSegment(l);
			last_row_group->InitializeAppend(state.row_group_append_state);
			continue;
		} else {
			break;
		}
	}
	state.current_row += row_t(total_append_count);

	auto local_stats_lock = state.stats.GetLock();

	for (idx_t col_idx = 0; col_idx < types.size(); col_idx++) {
		auto &column_stats = state.stats.GetStats(*local_stats_lock, col_idx);
		column_stats.UpdateDistinctStatistics(chunk.data[col_idx], chunk.size(), state.hashes);
	}

	return new_row_group;
}